

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::ForceManager::longRangeInteractions(ForceManager *this)

{
  Vector3d *pVVar1;
  Vector3d *pos;
  bool *pbVar2;
  double dVar3;
  double dVar4;
  CutoffMethod CVar5;
  uint uVar6;
  Snapshot *pSVar7;
  SimInfo *this_00;
  ForceDecomposition *pFVar8;
  pointer piVar9;
  pointer pdVar10;
  bool bVar11;
  SelfData *pSVar12;
  bool bVar13;
  uint i;
  uint uVar14;
  int iVar15;
  Molecule *pMVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double *pdVar17;
  ulong uVar18;
  undefined4 extraout_var_02;
  double (*padVar19) [3];
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  double (*padVar20) [3];
  uint i_3;
  Mat3x3d *pMVar21;
  uint j;
  ulong uVar22;
  long lVar23;
  uint *puVar24;
  ulong uVar25;
  uint j_1;
  long lVar26;
  CutoffGroup *this_01;
  pointer ppCVar27;
  double tmp;
  Mat3x3d bbox;
  vector<int,_std::allocator<int>_> atomListRow;
  vector<int,_std::allocator<int>_> atomListColumn;
  Vector3d fg;
  Vector3d dag;
  Vector3d d_grp;
  RealType surfacePotential;
  RealType reciprocalPotential;
  RealType rgrpsq;
  MoleculeIterator mi;
  Vector3d fij;
  Vector3d vel2;
  RealType dswdr;
  RealType rgrp;
  Vector3d gvel2;
  Vector<double,_7U> result_10;
  uint local_530;
  Mat3x3d local_528;
  ulong local_4e0;
  double local_4d8;
  ulong uStack_4d0;
  vector<int,_std::allocator<int>_> local_4c8;
  vector<int,_std::allocator<int>_> local_4a8;
  long local_488;
  InteractionData *local_480;
  double local_478 [4];
  long local_458;
  Mat3x3d *local_450;
  double local_448;
  uint local_43c;
  double local_438 [4];
  double local_418 [4];
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_3f8;
  SelfData *local_3f0;
  long local_3e8;
  Snapshot *local_3e0;
  RealType local_3d8;
  RealType local_3d0;
  double local_3c8;
  MoleculeIterator local_3c0;
  double local_3b8 [4];
  double local_398 [4];
  double local_378 [7];
  vector<int,_std::allocator<int>_> *local_340;
  vector<int,_std::allocator<int>_> *local_338;
  RealType *local_330;
  Vector3d *local_328;
  RealType *local_320;
  uint *local_318;
  RealType *local_310;
  potVec *local_308;
  potVec *local_300;
  potVec *local_2f8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2f0;
  double local_2d8;
  double local_2d0;
  double local_2c8 [8];
  double local_288;
  double dStack_280;
  double local_278;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  double local_1d8;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  double local_1b8;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  double local_198;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  double local_178;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  double local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  double local_138;
  potVec local_128;
  potVec local_e8;
  potVec local_a8;
  potVec local_68;
  undefined4 extraout_var_01;
  
  pSVar7 = this->info_->sman_->currentSnapshot_;
  (*this->fDecomp_->_vptr_ForceDecomposition[2])(this->fDecomp_,pSVar7);
  local_3c0._M_node = (_Base_ptr)0x0;
  this_00 = this->info_;
  local_3e0 = pSVar7;
  if (this_00->nCutoffGroups_ == this_00->nAtoms_) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (&(pSVar7->cgData).position,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)pSVar7)
    ;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (&(pSVar7->cgData).velocity,&(pSVar7->atomData).velocity);
  }
  else {
    pMVar16 = SimInfo::beginMolecule(this_00,&local_3c0);
    if (pMVar16 != (Molecule *)0x0) {
      do {
        ppCVar27 = (pMVar16->cutoffGroups_).
                   super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppCVar27 ==
            (pMVar16->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_01 = (CutoffGroup *)0x0;
        }
        else {
          this_01 = *ppCVar27;
        }
        while (this_01 != (CutoffGroup *)0x0) {
          ppCVar27 = ppCVar27 + 1;
          CutoffGroup::updateCOM(this_01);
          if (ppCVar27 ==
              (pMVar16->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            this_01 = (CutoffGroup *)0x0;
          }
          else {
            this_01 = *ppCVar27;
          }
        }
        pMVar16 = SimInfo::nextMolecule(this->info_,&local_3c0);
      } while (pMVar16 != (Molecule *)0x0);
    }
  }
  (*this->fDecomp_->_vptr_ForceDecomposition[5])();
  (*this->fDecomp_->_vptr_ForceDecomposition[4])();
  local_418[2] = 0.0;
  local_418[0] = 0.0;
  local_418[1] = 0.0;
  local_438[2] = 0.0;
  local_438[0] = 0.0;
  local_438[1] = 0.0;
  local_278 = 0.0;
  local_288 = 0.0;
  dStack_280 = 0.0;
  local_398[2] = 0.0;
  local_398[0] = 0.0;
  local_398[1] = 0.0;
  local_3b8[2] = 0.0;
  local_3b8[0] = 0.0;
  local_3b8[1] = 0.0;
  local_478[2] = 0.0;
  local_478[0] = 0.0;
  local_478[1] = 0.0;
  local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1f8 = 0.0;
  local_208 = 0.0;
  dStack_200 = 0.0;
  local_218 = 0.0;
  dStack_210 = 0.0;
  local_228 = 0.0;
  dStack_220 = 0.0;
  local_238 = 0.0;
  local_248 = 0.0;
  dStack_240 = 0.0;
  local_258 = 0.0;
  dStack_250 = 0.0;
  local_268 = 0.0;
  dStack_260 = 0.0;
  local_3d0 = 0.0;
  local_3d8 = 0.0;
  local_378[6] = 0.0;
  local_378[4] = 0.0;
  local_378[5] = 0.0;
  local_378[2] = 0.0;
  local_378[3] = 0.0;
  local_378[0] = 0.0;
  local_378[1] = 0.0;
  (this->idat).rcut = this->rCut_;
  CVar5 = this->cutoffMethod_;
  (this->idat).shiftedPot = CVar5 == SHIFTED_POTENTIAL;
  (this->idat).shiftedForce = CVar5 - SHIFTED_FORCE < 2;
  local_480 = &this->idat;
  bVar13 = this->doParticlePot_;
  (this->idat).doParticlePot = bVar13;
  bVar11 = this->doSitePotential_;
  (this->idat).doElectricField = this->doElectricField_;
  (this->idat).doSitePotential = bVar11;
  local_3f0 = &this->sdat;
  (this->sdat).doParticlePot = bVar13;
  uVar14 = this->info_->requiresPrepair_ ^ 1;
  local_3f8 = &this->savedPositions_;
  local_338 = &this->neighborList_;
  local_340 = &this->point_;
  local_328 = &(this->idat).eField1;
  local_330 = &(this->idat).sPot1;
  local_320 = &(this->idat).sw;
  local_2f8 = &(this->idat).pot;
  local_300 = &(this->idat).excludedPot;
  local_448 = 0.0;
  local_308 = &(this->idat).selePot;
  pVVar1 = &(this->idat).f1;
  local_310 = &(this->idat).dVdFQ1;
  pos = &(this->idat).d;
  local_450 = &this->virialTensor;
  local_43c = uVar14;
  do {
    local_4e0 = (ulong)uVar14;
    if (uVar14 == local_43c) {
      pFVar8 = this->fDecomp_;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                (&local_2f0,local_3f8);
      iVar15 = (*pFVar8->_vptr_ForceDecomposition[0x10])(pFVar8);
      if (local_2f0.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2f0.
                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2f0.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2f0.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((char)iVar15 != '\0') {
        if (this->usePeriodicBoundaryConditions_ == false) {
          Thermo::getBoundingBox(&local_528,this->thermo);
        }
        (*this->fDecomp_->_vptr_ForceDecomposition[0x11])
                  (this->fDecomp_,local_338,local_340,local_3f8);
      }
    }
    if ((int)((ulong)((long)(this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) < 2) {
      iVar15 = (int)local_4e0;
    }
    else {
      lVar26 = 0;
      uVar25 = local_4e0;
      do {
        local_488 = lVar26;
        iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x13])();
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_4c8,(vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var,iVar15));
        piVar9 = (this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = piVar9[local_488];
        lVar26 = (long)iVar15;
        local_3e8 = local_488 + 1;
        if (iVar15 < piVar9[local_488 + 1]) {
          local_530 = 1;
          do {
            uVar14 = (this->neighborList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar26];
            local_458 = lVar26;
            (*this->fDecomp_->_vptr_ForceDecomposition[0x19])(&local_528,this->fDecomp_,local_488);
            local_418[2] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][2];
            local_418[0] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][0];
            local_418[1] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][1];
            local_3c8 = 0.0;
            lVar26 = 0;
            do {
              local_3c8 = local_3c8 + local_418[lVar26] * local_418[lVar26];
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            if (local_3c8 < this->rCutSq_) {
              if ((int)uVar25 == 1) {
                local_3b8[0] = 0.0;
                local_3b8[1] = 0.0;
                local_3b8[2] = 0.0;
                local_328[1].super_Vector<double,_3U>.data_[1] = 0.0;
                local_328[1].super_Vector<double,_3U>.data_[2] = 0.0;
                (local_328->super_Vector<double,_3U>).data_[2] = 0.0;
                local_328[1].super_Vector<double,_3U>.data_[0] = 0.0;
                (local_328->super_Vector<double,_3U>).data_[0] = 0.0;
                (local_328->super_Vector<double,_3U>).data_[1] = 0.0;
                *local_330 = 0.0;
                local_330[1] = 0.0;
                local_448 = 0.0;
              }
              bVar13 = SwitchingFunction::getSwitch
                                 (this->switcher_,&local_3c8,local_320,&local_2d8,&local_2d0);
              iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x14])
                                 (this->fDecomp_,(ulong)uVar14);
              std::vector<int,_std::allocator<int>_>::operator=
                        (&local_4a8,
                         (vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var_00,iVar15));
              puVar24 = (uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
              if (this->doHeatFlux_ == true) {
                iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x12])
                                   (this->fDecomp_,(ulong)uVar14);
                pdVar17 = (double *)CONCAT44(extraout_var_01,iVar15);
                local_278 = pdVar17[2];
                local_288 = *pdVar17;
                dStack_280 = pdVar17[1];
                puVar24 = (uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
              }
              while (puVar24 !=
                     (uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish) {
                local_4d8 = (double)CONCAT44(local_4d8._4_4_,*puVar24);
                if (4 < (ulong)((long)local_4c8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start)) {
                  local_530 = 1;
                }
                if (this->doPotentialSelection_ == true) {
                  iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1f])
                                     (this->fDecomp_,*puVar24);
                  uVar18 = (ulong)iVar15;
                  uVar22 = uVar18 + 0x3f;
                  if (-1 < (long)uVar18) {
                    uVar22 = uVar18;
                  }
                  (this->idat).isSelected =
                       (*(ulong *)(((long)uVar22 >> 6) * 8 +
                                   *(long *)&(((this->seleMan_).ss_.bitsets_.
                                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                             super__Bvector_base<std::allocator<bool>_> + -8 +
                                  (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) * 8)
                        >> (uVar18 & 0x3f) & 1) != 0;
                }
                local_318 = puVar24;
                for (puVar24 = (uint *)local_4a8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start;
                    puVar24 !=
                    (uint *)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish; puVar24 = puVar24 + 1) {
                  uVar6 = *puVar24;
                  if (this->doPotentialSelection_ == true) {
                    iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x20])
                                       (this->fDecomp_,(ulong)uVar6);
                    uVar18 = (ulong)iVar15;
                    uVar22 = uVar18 + 0x3f;
                    if (-1 < (long)uVar18) {
                      uVar22 = uVar18;
                    }
                    pbVar2 = &(this->idat).isSelected;
                    *pbVar2 = (bool)(*pbVar2 |
                                    (*(ulong *)(((long)uVar22 >> 6) * 8 +
                                                *(long *)&(((this->seleMan_).ss_.bitsets_.
                                                                                                                        
                                                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  bitset_).
                                                  super__Bvector_base<std::allocator<bool>_> + -8 +
                                               (ulong)((uVar18 & 0x800000000000003f) <
                                                      0x8000000000000001) * 8) >> (uVar18 & 0x3f) &
                                    1) != 0);
                  }
                  iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1d])
                                     (this->fDecomp_,(ulong)local_4d8 & 0xffffffff,(ulong)uVar6,
                                      local_488,(ulong)uVar14);
                  if ((char)iVar15 == '\0') {
                    (this->idat).vpair = 0.0;
                    local_2f8->data_[6] = 0.0;
                    local_2f8->data_[4] = 0.0;
                    local_2f8->data_[5] = 0.0;
                    local_2f8->data_[2] = 0.0;
                    local_2f8->data_[3] = 0.0;
                    local_2f8->data_[0] = 0.0;
                    local_2f8->data_[1] = 0.0;
                    local_300->data_[6] = 0.0;
                    local_300->data_[4] = 0.0;
                    local_300->data_[5] = 0.0;
                    local_300->data_[2] = 0.0;
                    local_300->data_[3] = 0.0;
                    local_300->data_[0] = 0.0;
                    local_300->data_[1] = 0.0;
                    local_308->data_[6] = 0.0;
                    local_308->data_[4] = 0.0;
                    local_308->data_[5] = 0.0;
                    local_308->data_[2] = 0.0;
                    local_308->data_[3] = 0.0;
                    local_308->data_[0] = 0.0;
                    local_308->data_[1] = 0.0;
                    (this->idat).f1.super_Vector<double,_3U>.data_[2] = 0.0;
                    (pVVar1->super_Vector<double,_3U>).data_[0] = 0.0;
                    (this->idat).f1.super_Vector<double,_3U>.data_[1] = 0.0;
                    *local_310 = 0.0;
                    local_310[1] = 0.0;
                    (*this->fDecomp_->_vptr_ForceDecomposition[0x26])
                              (this->fDecomp_,local_480,(ulong)local_4d8 & 0xffffffff,(ulong)uVar6,
                               (ulong)local_530);
                    iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x22])
                                       (this->fDecomp_,(ulong)local_4d8 & 0xffffffff,(ulong)uVar6);
                    (this->idat).topoDist = iVar15;
                    pdVar10 = (this->electrostaticScale_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    (this->idat).vdwMult =
                         (this->vdwScale_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar15];
                    (this->idat).electroMult = pdVar10[iVar15];
                    if (((long)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start == 4) &&
                       ((long)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start == 4)) {
                      (this->idat).d.super_Vector<double,_3U>.data_[2] = local_418[2];
                      (pos->super_Vector<double,_3U>).data_[0] = local_418[0];
                      (this->idat).d.super_Vector<double,_3U>.data_[1] = local_418[1];
                      (this->idat).r2 = local_3c8;
                      pdVar17 = &local_288;
                      if (this->doHeatFlux_ != false) {
LAB_0012dbed:
                        local_398[2] = pdVar17[2];
                        local_398[0] = *pdVar17;
                        local_398[1] = pdVar17[1];
                      }
                    }
                    else {
                      (*this->fDecomp_->_vptr_ForceDecomposition[0x1a])
                                (&local_528,this->fDecomp_,(ulong)local_4d8 & 0xffffffff,
                                 (ulong)uVar6);
                      if ((Mat3x3d *)pos != &local_528) {
                        (this->idat).d.super_Vector<double,_3U>.data_[2] =
                             local_528.super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_[0][2];
                        (pos->super_Vector<double,_3U>).data_[0] =
                             local_528.super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_[0][0];
                        (this->idat).d.super_Vector<double,_3U>.data_[1] =
                             local_528.super_SquareMatrix<double,_3>.
                             super_RectMatrix<double,_3U,_3U>.data_[0][1];
                      }
                      Snapshot::wrapVector(local_3e0,pos);
                      uVar25 = local_4e0;
                      dVar3 = 0.0;
                      lVar26 = 0;
                      do {
                        dVar4 = (pos->super_Vector<double,_3U>).data_[lVar26];
                        dVar3 = dVar3 + dVar4 * dVar4;
                        lVar26 = lVar26 + 1;
                      } while (lVar26 != 3);
                      (this->idat).r2 = dVar3;
                      if (this->doHeatFlux_ == true) {
                        iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x25])
                                           (this->fDecomp_,(ulong)uVar6);
                        pdVar17 = (double *)CONCAT44(extraout_var_02,iVar15);
                        goto LAB_0012dbed;
                      }
                    }
                    dVar3 = (this->idat).r2;
                    if (dVar3 < 0.0) {
                      dVar3 = sqrt(dVar3);
                    }
                    else {
                      dVar3 = SQRT(dVar3);
                    }
                    (this->idat).rij = dVar3;
                    if ((int)uVar25 == 0) {
                      InteractionManager::doPrePair(this->interactionMan_,local_480);
                      (*this->fDecomp_->_vptr_ForceDecomposition[0x27])
                                (this->fDecomp_,local_480,(ulong)local_4d8 & 0xffffffff,(ulong)uVar6
                                );
                    }
                    else {
                      InteractionManager::doPair(this->interactionMan_,local_480);
                      (*this->fDecomp_->_vptr_ForceDecomposition[0x28])
                                (this->fDecomp_,local_480,(ulong)local_4d8 & 0xffffffff);
                      dVar3 = (this->idat).vpair;
                      lVar26 = 0;
                      do {
                        local_3b8[lVar26] =
                             (pVVar1->super_Vector<double,_3U>).data_[lVar26] + local_3b8[lVar26];
                        lVar26 = lVar26 + 1;
                      } while (lVar26 != 3);
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][0] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][1] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][1] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][2] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][2] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][0] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][0] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][1] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][2] = 0.0;
                      padVar19 = (double (*) [3])&local_528;
                      lVar26 = 0;
                      do {
                        dVar4 = (this->idat).d.super_Vector<double,_3U>.data_[lVar26];
                        lVar23 = 0;
                        do {
                          (((SquareMatrix<double,_3> *)*padVar19)->super_RectMatrix<double,_3U,_3U>)
                          .data_[0][lVar23] =
                               (pVVar1->super_Vector<double,_3U>).data_[lVar23] * dVar4;
                          lVar23 = lVar23 + 1;
                        } while (lVar23 != 3);
                        lVar26 = lVar26 + 1;
                        padVar19 = padVar19 + 1;
                      } while (lVar26 != 3);
                      padVar19 = (double (*) [3])&local_528;
                      lVar26 = 0;
                      pMVar21 = local_450;
                      do {
                        lVar23 = 0;
                        do {
                          (pMVar21->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar23] =
                               (pMVar21->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[0][lVar23] -
                               (((SquareMatrix<double,_3> *)*padVar19)->
                               super_RectMatrix<double,_3U,_3U>).data_[0][lVar23];
                          lVar23 = lVar23 + 1;
                        } while (lVar23 != 3);
                        lVar26 = lVar26 + 1;
                        pMVar21 = (Mat3x3d *)
                                  ((pMVar21->super_SquareMatrix<double,_3>).
                                   super_RectMatrix<double,_3U,_3U>.data_ + 1);
                        padVar19 = padVar19 + 1;
                      } while (lVar26 != 3);
                      local_448 = local_448 + dVar3;
                      if (this->doHeatFlux_ == true) {
                        pFVar8 = this->fDecomp_;
                        dVar3 = 0.0;
                        lVar26 = 0;
                        do {
                          dVar3 = dVar3 + (pVVar1->super_Vector<double,_3U>).data_[lVar26] *
                                          local_398[lVar26];
                          lVar26 = lVar26 + 1;
                        } while (lVar26 != 3);
                        local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][0] = 0.0;
                        local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][1] = 0.0;
                        local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][2] = 0.0;
                        lVar26 = 0;
                        do {
                          local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar26] = (pos->super_Vector<double,_3U>).data_[lVar26] * dVar3;
                          lVar26 = lVar26 + 1;
                        } while (lVar26 != 3);
                        local_138 = local_528.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][2];
                        local_148 = local_528.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                        uStack_144 = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                        uStack_140 = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                        uStack_13c = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                        (*pFVar8->_vptr_ForceDecomposition[0x2d])(pFVar8,&local_148);
                      }
                    }
                    local_530 = 0;
                  }
                }
                puVar24 = local_318 + 1;
              }
              if (bVar13 && (int)uVar25 == 1) {
                local_4d8 = (local_2d8 * local_448) / local_2d0;
                local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
                     = 0.0;
                local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1]
                     = 0.0;
                local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2]
                     = 0.0;
                lVar26 = 0;
                padVar19 = (double (*) [3])&local_528;
                do {
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [lVar26] = local_418[lVar26] * local_4d8;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 3);
                local_478[2] = local_528.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][2];
                local_478[0] = local_528.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0];
                local_478[1] = local_528.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1];
                lVar26 = 0;
                do {
                  local_3b8[lVar26] = local_478[lVar26] + local_3b8[lVar26];
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 3);
                uStack_4d0 = 0;
                puVar24 = (uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                if ((((long)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start == 4) &&
                    ((long)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start == 4)) &&
                   (iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x1d])
                                       (this->fDecomp_,
                                        (ulong)(uint)*local_4c8.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start,
                                        (ulong)(uint)*local_4a8.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start,
                                        local_488,(ulong)uVar14),
                   puVar24 = (uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start, (char)iVar15 == '\0')) {
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [0] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [1] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [1] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [2] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [0] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [1] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [2] = 0.0;
                  lVar26 = 0;
                  padVar20 = padVar19;
                  do {
                    dVar3 = (this->idat).d.super_Vector<double,_3U>.data_[lVar26];
                    lVar23 = 0;
                    do {
                      (((SquareMatrix<double,_3> *)*padVar20)->super_RectMatrix<double,_3U,_3U>).
                      data_[0][lVar23] = local_478[lVar23] * dVar3;
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != 3);
                    lVar26 = lVar26 + 1;
                    padVar20 = padVar20 + 1;
                  } while (lVar26 != 3);
                  lVar26 = 0;
                  pMVar21 = local_450;
                  do {
                    lVar23 = 0;
                    do {
                      (pMVar21->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                      data_[0][lVar23] =
                           (pMVar21->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
                           .data_[0][lVar23] - (*padVar19)[lVar23];
                      lVar23 = lVar23 + 1;
                    } while (lVar23 != 3);
                    lVar26 = lVar26 + 1;
                    pMVar21 = (Mat3x3d *)
                              ((pMVar21->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_ + 1);
                    padVar19 = padVar19 + 1;
                  } while (lVar26 != 3);
                  puVar24 = (uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                  if (this->doHeatFlux_ == true) {
                    pFVar8 = this->fDecomp_;
                    dVar3 = 0.0;
                    lVar26 = 0;
                    do {
                      dVar3 = dVar3 + local_478[lVar26] * local_398[lVar26];
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 3);
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][0] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][1] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][2] = 0.0;
                    lVar26 = 0;
                    do {
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][lVar26] = (pos->super_Vector<double,_3U>).data_[lVar26] * dVar3;
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 3);
                    local_158 = local_528.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][2];
                    local_168 = local_528.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                    uStack_164 = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                    uStack_160 = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                    uStack_15c = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                    (*pFVar8->_vptr_ForceDecomposition[0x2d])(pFVar8,&local_168);
                    puVar24 = (uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start;
                  }
                }
                for (; puVar24 !=
                       (uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish; puVar24 = puVar24 + 1) {
                  uVar14 = *puVar24;
                  iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x17])
                                     (this->fDecomp_,(ulong)uVar14);
                  dVar3 = *(double *)CONCAT44(extraout_var_03,iVar15);
                  local_2c8[0] = 0.0;
                  local_2c8[1] = 0.0;
                  local_2c8[2] = 0.0;
                  lVar26 = 0;
                  do {
                    local_2c8[lVar26] = local_418[lVar26] * local_4d8;
                    lVar26 = lVar26 + 1;
                  } while (lVar26 != 3);
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [1] = 0.0;
                  local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2] = 0.0;
                  lVar26 = 0;
                  do {
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][lVar26] = local_2c8[lVar26] * dVar3;
                    lVar26 = lVar26 + 1;
                  } while (lVar26 != 3);
                  local_478[2] = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][2];
                  local_478[0] = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][0];
                  local_478[1] = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1];
                  local_178 = local_528.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][2];
                  local_188 = local_528.super_SquareMatrix<double,_3>.
                              super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                  uStack_184 = local_528.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                  uStack_180 = local_528.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                  uStack_17c = local_528.super_SquareMatrix<double,_3>.
                               super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                  (*this->fDecomp_->_vptr_ForceDecomposition[0x23])
                            (this->fDecomp_,(ulong)uVar14,&local_188);
                  if ((4 < (ulong)((long)local_4c8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_4c8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start)) &&
                     (this->info_->usesAtomicVirial_ == true)) {
                    padVar19 = (double (*) [3])&local_528;
                    (*this->fDecomp_->_vptr_ForceDecomposition[0x15])
                              (padVar19,this->fDecomp_,(ulong)uVar14);
                    local_438[2] = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][2];
                    local_438[0] = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0];
                    local_438[1] = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1];
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [2][0] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [2][1] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [1][1] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [1][2] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][2] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [1][0] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][0] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][1] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [2][2] = 0.0;
                    lVar26 = 0;
                    padVar20 = padVar19;
                    do {
                      dVar3 = local_438[lVar26];
                      lVar23 = 0;
                      do {
                        (((SquareMatrix<double,_3> *)*padVar20)->super_RectMatrix<double,_3U,_3U>).
                        data_[0][lVar23] = local_478[lVar23] * dVar3;
                        lVar23 = lVar23 + 1;
                      } while (lVar23 != 3);
                      lVar26 = lVar26 + 1;
                      padVar20 = padVar20 + 1;
                    } while (lVar26 != 3);
                    lVar26 = 0;
                    pMVar21 = local_450;
                    do {
                      lVar23 = 0;
                      do {
                        (pMVar21->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0][lVar23] =
                             (pMVar21->super_SquareMatrix<double,_3>).
                             super_RectMatrix<double,_3U,_3U>.data_[0][lVar23] - (*padVar19)[lVar23]
                        ;
                        lVar23 = lVar23 + 1;
                      } while (lVar23 != 3);
                      lVar26 = lVar26 + 1;
                      pMVar21 = (Mat3x3d *)
                                ((pMVar21->super_SquareMatrix<double,_3>).
                                 super_RectMatrix<double,_3U,_3U>.data_ + 1);
                      padVar19 = padVar19 + 1;
                    } while (lVar26 != 3);
                    if (this->doHeatFlux_ == true) {
                      pFVar8 = this->fDecomp_;
                      dVar3 = 0.0;
                      lVar26 = 0;
                      do {
                        dVar3 = dVar3 + local_478[lVar26] * local_398[lVar26];
                        lVar26 = lVar26 + 1;
                      } while (lVar26 != 3);
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][0] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][1] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][2] = 0.0;
                      lVar26 = 0;
                      do {
                        local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][lVar26] = local_438[lVar26] * dVar3;
                        lVar26 = lVar26 + 1;
                      } while (lVar26 != 3);
                      local_198 = local_528.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][2];
                      local_1a8 = local_528.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                      uStack_1a4 = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                      uStack_1a0 = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                      uStack_19c = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                      (*pFVar8->_vptr_ForceDecomposition[0x2d])(pFVar8,&local_1a8);
                    }
                  }
                }
                uVar25 = local_4e0;
                if (local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_4d8 = -local_4d8;
                  uStack_4d0 = uStack_4d0 ^ 0x8000000000000000;
                  puVar24 = (uint *)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                  do {
                    uVar14 = *puVar24;
                    iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x18])
                                       (this->fDecomp_,(ulong)uVar14);
                    dVar3 = *(double *)CONCAT44(extraout_var_04,iVar15);
                    local_2c8[0] = 0.0;
                    local_2c8[1] = 0.0;
                    local_2c8[2] = 0.0;
                    lVar26 = 0;
                    do {
                      local_2c8[lVar26] = local_418[lVar26] * local_4d8;
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 3);
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][0] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][1] = 0.0;
                    local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                    [0][2] = 0.0;
                    lVar26 = 0;
                    do {
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][lVar26] = local_2c8[lVar26] * dVar3;
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 3);
                    local_478[2] = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][2];
                    local_478[0] = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][0];
                    local_478[1] = local_528.super_SquareMatrix<double,_3>.
                                   super_RectMatrix<double,_3U,_3U>.data_[0][1];
                    local_1b8 = local_528.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][2];
                    local_1c8 = local_528.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                    uStack_1c4 = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                    uStack_1c0 = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                    uStack_1bc = local_528.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                    (*this->fDecomp_->_vptr_ForceDecomposition[0x24])
                              (this->fDecomp_,(ulong)uVar14,&local_1c8);
                    if ((4 < (ulong)((long)local_4a8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_4a8.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start)) &&
                       (this->info_->usesAtomicVirial_ == true)) {
                      padVar19 = (double (*) [3])&local_528;
                      (*this->fDecomp_->_vptr_ForceDecomposition[0x16])
                                (padVar19,this->fDecomp_,(ulong)uVar14);
                      local_438[2] = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][2];
                      local_438[0] = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][0];
                      local_438[1] = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1];
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][0] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][1] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][1] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][2] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][2] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [1][0] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][0] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0][1] = 0.0;
                      local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [2][2] = 0.0;
                      lVar26 = 0;
                      padVar20 = padVar19;
                      do {
                        dVar3 = local_438[lVar26];
                        lVar23 = 0;
                        do {
                          (((SquareMatrix<double,_3> *)*padVar20)->super_RectMatrix<double,_3U,_3U>)
                          .data_[0][lVar23] = local_478[lVar23] * dVar3;
                          lVar23 = lVar23 + 1;
                        } while (lVar23 != 3);
                        lVar26 = lVar26 + 1;
                        padVar20 = padVar20 + 1;
                      } while (lVar26 != 3);
                      lVar26 = 0;
                      pMVar21 = local_450;
                      do {
                        lVar23 = 0;
                        do {
                          (pMVar21->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar23] =
                               (pMVar21->super_SquareMatrix<double,_3>).
                               super_RectMatrix<double,_3U,_3U>.data_[0][lVar23] -
                               (*padVar19)[lVar23];
                          lVar23 = lVar23 + 1;
                        } while (lVar23 != 3);
                        lVar26 = lVar26 + 1;
                        pMVar21 = (Mat3x3d *)
                                  ((pMVar21->super_SquareMatrix<double,_3>).
                                   super_RectMatrix<double,_3U,_3U>.data_ + 1);
                        padVar19 = padVar19 + 1;
                      } while (lVar26 != 3);
                      if (this->doHeatFlux_ == true) {
                        pFVar8 = this->fDecomp_;
                        dVar3 = 0.0;
                        lVar26 = 0;
                        do {
                          dVar3 = dVar3 + local_478[lVar26] * local_398[lVar26];
                          lVar26 = lVar26 + 1;
                        } while (lVar26 != 3);
                        local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][0] = 0.0;
                        local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][1] = 0.0;
                        local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0][2] = 0.0;
                        lVar26 = 0;
                        do {
                          local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar26] = local_438[lVar26] * dVar3;
                          lVar26 = lVar26 + 1;
                        } while (lVar26 != 3);
                        local_1d8 = local_528.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][2];
                        local_1e8 = local_528.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_[0][0]._0_4_;
                        uStack_1e4 = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][0]._4_4_;
                        uStack_1e0 = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1]._0_4_;
                        uStack_1dc = local_528.super_SquareMatrix<double,_3>.
                                     super_RectMatrix<double,_3U,_3U>.data_[0][1]._4_4_;
                        (*pFVar8->_vptr_ForceDecomposition[0x2d])(pFVar8,&local_1e8);
                      }
                    }
                    puVar24 = puVar24 + 1;
                    uVar25 = local_4e0;
                  } while (puVar24 !=
                           (uint *)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
                }
              }
            }
            lVar26 = local_458 + 1;
          } while (lVar26 < (this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_3e8]);
        }
        iVar15 = (int)uVar25;
        lVar26 = local_3e8;
      } while (local_3e8 <
               ((long)(this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20);
    }
    if ((iVar15 == 0) && (this->info_->requiresPrepair_ == true)) {
      (*this->fDecomp_->_vptr_ForceDecomposition[6])();
      if (this->info_->nAtoms_ != 0) {
        uVar25 = 0;
        do {
          if (this->doPotentialSelection_ == true) {
            iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x21])(this->fDecomp_,uVar25);
            uVar18 = (ulong)iVar15;
            uVar22 = uVar18 + 0x3f;
            if (-1 < (long)uVar18) {
              uVar22 = uVar18;
            }
            (this->sdat).isSelected =
                 (*(ulong *)(((long)uVar22 >> 6) * 8 +
                             *(long *)&(((this->seleMan_).ss_.bitsets_.
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                       super__Bvector_base<std::allocator<bool>_> + -8 +
                            (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                  (uVar18 & 0x3f) & 1) != 0;
          }
          pSVar12 = local_3f0;
          (*this->fDecomp_->_vptr_ForceDecomposition[0x2b])(this->fDecomp_,local_3f0,uVar25);
          InteractionManager::doPreForce(this->interactionMan_,pSVar12);
          (*this->fDecomp_->_vptr_ForceDecomposition[0x2c])(this->fDecomp_,pSVar12,uVar25);
          uVar14 = (int)uVar25 + 1;
          uVar25 = (ulong)uVar14;
        } while (uVar14 < (uint)this->info_->nAtoms_);
      }
      (*this->fDecomp_->_vptr_ForceDecomposition[7])();
      iVar15 = (int)local_4e0;
    }
    uVar14 = iVar15 + 1;
    if (iVar15 != 0) {
      (*this->fDecomp_->_vptr_ForceDecomposition[8])();
      pSVar7 = local_3e0;
      if (this->cutoffMethod_ == EWALD_FULL) {
        InteractionManager::doReciprocalSpaceSum(this->interactionMan_,&local_3d0);
        Snapshot::setReciprocalPotential(pSVar7,local_3d0);
      }
      if (this->useSurfaceTerm_ == true) {
        InteractionManager::doSurfaceTerm
                  (this->interactionMan_,this->useSlabGeometry_,this->axis_,&local_3d8);
        Snapshot::setSurfacePotential(pSVar7,local_3d8);
      }
      pSVar12 = local_3f0;
      if ((this->info_->requiresSelfCorrection_ == true) && (this->info_->nAtoms_ != 0)) {
        uVar25 = 0;
        do {
          if (this->doPotentialSelection_ == true) {
            iVar15 = (*this->fDecomp_->_vptr_ForceDecomposition[0x21])(this->fDecomp_,uVar25);
            uVar18 = (ulong)iVar15;
            uVar22 = uVar18 + 0x3f;
            if (-1 < (long)uVar18) {
              uVar22 = uVar18;
            }
            (this->sdat).isSelected =
                 (*(ulong *)(((long)uVar22 >> 6) * 8 +
                             *(long *)&(((this->seleMan_).ss_.bitsets_.
                                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                       super__Bvector_base<std::allocator<bool>_> + -8 +
                            (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                  (uVar18 & 0x3f) & 1) != 0;
          }
          (*this->fDecomp_->_vptr_ForceDecomposition[0x29])(this->fDecomp_,pSVar12,uVar25);
          InteractionManager::doSelfCorrection(this->interactionMan_,pSVar12);
          (*this->fDecomp_->_vptr_ForceDecomposition[0x2a])(this->fDecomp_,pSVar12,uVar25);
          uVar14 = (int)uVar25 + 1;
          uVar25 = (ulong)uVar14;
        } while (uVar14 < (uint)this->info_->nAtoms_);
      }
      (*this->fDecomp_->_vptr_ForceDecomposition[9])();
      (*this->fDecomp_->_vptr_ForceDecomposition[0xb])(&local_528);
      local_1f8 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [0];
      local_208 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [1];
      dStack_200 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [2];
      local_218 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2];
      dStack_210 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [0];
      local_228 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0];
      dStack_220 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   [1];
      local_68.data_[0] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
      local_68.data_[1] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
      local_68.data_[2] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
      local_68.data_[3] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0];
      local_68.data_[4] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
      local_68.data_[5] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
      local_68.data_[6] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0];
      Snapshot::setLongRangePotentials(pSVar7,&local_68);
      (*this->fDecomp_->_vptr_ForceDecomposition[10])(&local_528);
      local_238 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [0];
      local_248 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                  [1];
      dStack_240 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [2];
      local_258 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [2];
      dStack_250 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [0];
      local_268 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                  [0];
      dStack_260 = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   [1];
      local_a8.data_[0] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
      local_a8.data_[1] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
      local_a8.data_[2] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
      local_a8.data_[3] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0];
      local_a8.data_[4] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
      local_a8.data_[5] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
      local_a8.data_[6] =
           local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0];
      Snapshot::setSelfPotentials(pSVar7,&local_a8);
      (*this->fDecomp_->_vptr_ForceDecomposition[0xe])(&local_528);
      (*this->fDecomp_->_vptr_ForceDecomposition[0xc])(local_2c8);
      local_128.data_[4] = 0.0;
      local_128.data_[5] = 0.0;
      local_128.data_[2] = 0.0;
      local_128.data_[3] = 0.0;
      local_128.data_[0] = 0.0;
      local_128.data_[1] = 0.0;
      local_128.data_[6] = 0.0;
      lVar26 = 0;
      do {
        local_128.data_[lVar26] =
             local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
             [lVar26] + local_2c8[lVar26];
        lVar26 = lVar26 + 1;
      } while (lVar26 != 7);
      Snapshot::setExcludedPotentials(pSVar7,&local_128);
      if (this->doPotentialSelection_ == true) {
        Snapshot::getSelectionPotentials((potVec *)&local_528,pSVar7);
        local_378[6] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[2][0];
        local_378[4] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[1][1];
        local_378[5] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[1][2];
        local_378[2] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0][2];
        local_378[3] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[1][0];
        local_378[0] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0][0];
        local_378[1] = local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0][1];
        (*this->fDecomp_->_vptr_ForceDecomposition[0xf])();
        lVar26 = 0;
        do {
          local_378[lVar26] =
               local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
               [lVar26] + local_378[lVar26];
          lVar26 = lVar26 + 1;
        } while (lVar26 != 7);
        (*this->fDecomp_->_vptr_ForceDecomposition[0xd])(&local_528);
        lVar26 = 0;
        do {
          local_378[lVar26] =
               local_528.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
               [lVar26] + local_378[lVar26];
          lVar26 = lVar26 + 1;
        } while (lVar26 != 7);
        local_e8.data_[0] = local_378[0];
        local_e8.data_[1] = local_378[1];
        local_e8.data_[2] = local_378[2];
        local_e8.data_[3] = local_378[3];
        local_e8.data_[4] = local_378[4];
        local_e8.data_[5] = local_378[5];
        local_e8.data_[6] = local_378[6];
        Snapshot::setSelectionPotentials(pSVar7,&local_e8);
      }
      if ((uint *)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((uint *)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void ForceManager::longRangeInteractions() {
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    fDecomp_->setSnapshot(curSnapshot);

    DataStorage* config   = &(curSnapshot->atomData);
    DataStorage* cgConfig = &(curSnapshot->cgData);

    // calculate the center of mass of cutoff group

    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    if (info_->getNCutoffGroups() != info_->getNAtoms()) {
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          cg->updateCOM();
        }
      }
    } else {
      // center of mass of the group is the same as position of the atom
      // if cutoff group does not exist
      cgConfig->position = config->position;
      cgConfig->velocity = config->velocity;
    }

    fDecomp_->zeroWorkArrays();
    fDecomp_->distributeData();

    int cg1, cg2, atom1, atom2;
    Vector3d d_grp, dag, gvel2, vel2;
    RealType rgrpsq, rgrp;
    RealType vij(0.0);
    Vector3d fij, fg, f1;
    bool in_switching_region;
    RealType dswdr, swderiv;
    vector<int> atomListColumn, atomListRow;

    potVec longRangePotential(0.0);
    potVec selfPotential(0.0);
    RealType reciprocalPotential(0.0);
    RealType surfacePotential(0.0);
    potVec selectionPotential(0.0);

    RealType mf;
    bool newAtom1;
    int gid1, gid2;

    vector<int>::iterator ia, jb;

    int loopStart, loopEnd;

    idat.rcut       = rCut_;
    idat.shiftedPot = (cutoffMethod_ == SHIFTED_POTENTIAL) ? true : false;
    idat.shiftedForce =
        (cutoffMethod_ == SHIFTED_FORCE || cutoffMethod_ == TAYLOR_SHIFTED) ?
            true :
            false;
    idat.doParticlePot   = doParticlePot_;
    idat.doElectricField = doElectricField_;
    idat.doSitePotential = doSitePotential_;
    sdat.doParticlePot   = doParticlePot_;

    loopEnd = PAIR_LOOP;
    if (info_->requiresPrepair()) {
      loopStart = PREPAIR_LOOP;
    } else {
      loopStart = PAIR_LOOP;
    }
    for (int iLoop = loopStart; iLoop <= loopEnd; iLoop++) {
      if (iLoop == loopStart) {
        bool update_nlist = fDecomp_->checkNeighborList(savedPositions_);

        if (update_nlist) {
          if (!usePeriodicBoundaryConditions_)
            Mat3x3d bbox = thermo->getBoundingBox();
          fDecomp_->buildNeighborList(neighborList_, point_, savedPositions_);
        }
      }

      for (cg1 = 0; cg1 < int(point_.size()) - 1; cg1++) {
        atomListRow = fDecomp_->getAtomsInGroupRow(cg1);
        newAtom1    = true;

        for (int m2 = point_[cg1]; m2 < point_[cg1 + 1]; m2++) {
          cg2 = neighborList_[m2];

          d_grp = fDecomp_->getIntergroupVector(cg1, cg2);

          // already wrapped in the getIntergroupVector call:
          // curSnapshot->wrapVector(d_grp);
          rgrpsq = d_grp.lengthSquare();

          if (rgrpsq < rCutSq_) {
            if (iLoop == PAIR_LOOP) {
              vij = 0.0;
              fij.zero();
              idat.eField1.zero();
              idat.eField2.zero();
              idat.sPot1 = 0.0;
              idat.sPot2 = 0.0;
            }

            in_switching_region =
                switcher_->getSwitch(rgrpsq, idat.sw, dswdr, rgrp);

            atomListColumn = fDecomp_->getAtomsInGroupColumn(cg2);

            if (doHeatFlux_) gvel2 = fDecomp_->getGroupVelocityColumn(cg2);

            for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
              atom1 = (*ia);
              if (atomListRow.size() > 1) newAtom1 = true;

              if (doPotentialSelection_) {
                gid1            = fDecomp_->getGlobalIDRow(atom1);
                idat.isSelected = seleMan_.isGlobalIDSelected(gid1);
              }

              for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                   ++jb) {
                atom2 = (*jb);

                if (doPotentialSelection_) {
                  gid2 = fDecomp_->getGlobalIDCol(atom2);
                  idat.isSelected |= seleMan_.isGlobalIDSelected(gid2);
                }

                if (!fDecomp_->skipAtomPair(atom1, atom2, cg1, cg2)) {
                  idat.vpair       = 0.0;
                  idat.pot         = 0.0;
                  idat.excludedPot = 0.0;
                  idat.selePot     = 0.0;
                  idat.f1.zero();
                  idat.dVdFQ1 = 0.0;
                  idat.dVdFQ2 = 0.0;

                  fDecomp_->fillInteractionData(idat, atom1, atom2, newAtom1);
                  newAtom1 = false;

                  idat.topoDist =
                      fDecomp_->getTopologicalDistance(atom1, atom2);
                  idat.vdwMult     = vdwScale_[idat.topoDist];
                  idat.electroMult = electrostaticScale_[idat.topoDist];

                  if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                    idat.d  = d_grp;
                    idat.r2 = rgrpsq;
                    if (doHeatFlux_) vel2 = gvel2;
                  } else {
                    idat.d = fDecomp_->getInteratomicVector(atom1, atom2);
                    curSnapshot->wrapVector(idat.d);
                    idat.r2 = idat.d.lengthSquare();
                    if (doHeatFlux_)
                      vel2 = fDecomp_->getAtomVelocityColumn(atom2);
                  }

                  idat.rij = sqrt(idat.r2);

                  if (iLoop == PREPAIR_LOOP) {
                    interactionMan_->doPrePair(idat);
                    fDecomp_->unpackPrePairData(idat, atom1, atom2);
                  } else {
                    interactionMan_->doPair(idat);
                    fDecomp_->unpackInteractionData(idat, atom1, atom2);
                    vij += idat.vpair;
                    fij += idat.f1;
                    virialTensor -= outProduct(idat.d, idat.f1);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(idat.f1, vel2));
                  }
                }
              }
            }

            if (iLoop == PAIR_LOOP) {
              if (in_switching_region) {
                swderiv = vij * dswdr / rgrp;
                fg      = swderiv * d_grp;
                fij += fg;

                if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                  if (!fDecomp_->skipAtomPair(atomListRow[0], atomListColumn[0],
                                              cg1, cg2)) {
                    virialTensor -= outProduct(idat.d, fg);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(fg, vel2));
                  }
                }

                for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
                  atom1 = (*ia);
                  mf    = fDecomp_->getMassFactorRow(atom1);
                  // fg is the force on atom ia due to cutoff group's
                  // presence in switching region
                  fg = swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomRow(atom1, fg);
                  if (atomListRow.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorRow(atom1, cg1);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
                for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                     ++jb) {
                  atom2 = (*jb);
                  mf    = fDecomp_->getMassFactorColumn(atom2);
                  // fg is the force on atom jb due to cutoff group's
                  // presence in switching region
                  fg = -swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomColumn(atom2, fg);

                  if (atomListColumn.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorColumn(atom2, cg2);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
              }
              // if (!info_->usesAtomicVirial()) {
              //  virialTensor -= outProduct(d_grp, fij);
              //  if (doHeatFlux_)
              //     fDecomp_->addToHeatFlux( d_grp * dot(fij, vel2));
              //}
            }
          }
        }
      }

      if (iLoop == PREPAIR_LOOP) {
        if (info_->requiresPrepair()) {
          fDecomp_->collectIntermediateData();

          for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
            if (doPotentialSelection_) {
              gid1            = fDecomp_->getGlobalID(atom1);
              sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
            }
            fDecomp_->fillPreForceData(sdat, atom1);
            interactionMan_->doPreForce(sdat);
            fDecomp_->unpackPreForceData(sdat, atom1);
          }

          fDecomp_->distributeIntermediateData();
        }
      }
    }

    // collects pairwise information
    fDecomp_->collectData();
    if (cutoffMethod_ == EWALD_FULL) {
      interactionMan_->doReciprocalSpaceSum(reciprocalPotential);
      curSnapshot->setReciprocalPotential(reciprocalPotential);
    }

    if (useSurfaceTerm_) {
      interactionMan_->doSurfaceTerm(useSlabGeometry_, axis_, surfacePotential);
      curSnapshot->setSurfacePotential(surfacePotential);
    }

    if (info_->requiresSelfCorrection()) {
      for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
        if (doPotentialSelection_) {
          gid1            = fDecomp_->getGlobalID(atom1);
          sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
        }
        fDecomp_->fillSelfData(sdat, atom1);
        interactionMan_->doSelfCorrection(sdat);
        fDecomp_->unpackSelfData(sdat, atom1);
      }
    }

    // collects single-atom information
    fDecomp_->collectSelfData();

    longRangePotential = fDecomp_->getPairwisePotential();
    curSnapshot->setLongRangePotentials(longRangePotential);

    selfPotential = fDecomp_->getSelfPotential();
    curSnapshot->setSelfPotentials(selfPotential);

    curSnapshot->setExcludedPotentials(fDecomp_->getExcludedSelfPotential() +
                                       fDecomp_->getExcludedPotential());

    if (doPotentialSelection_) {
      selectionPotential = curSnapshot->getSelectionPotentials();
      selectionPotential += fDecomp_->getSelectedSelfPotential();
      selectionPotential += fDecomp_->getSelectedPotential();
      curSnapshot->setSelectionPotentials(selectionPotential);
    }
  }